

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O3

void print_result(int sock,int rv,cmdCmd_t cmd)

{
  char cVar1;
  ushort **ppuVar2;
  undefined8 uVar3;
  anon_union_4_3_5af155d6_for_cmdCmd_t_3 aVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = cmd._8_8_;
  uVar3 = cmd._0_8_;
  if (8 < (uint)rv) {
    return;
  }
  uVar5 = uVar8 >> 0x20;
  aVar4 = cmd.field_3;
  switch(rv) {
  default:
    if ((long)uVar8 < 0) {
      print_result_cold_5();
    }
    break;
  case 2:
    printf("%d\n",uVar5,uVar3);
    if ((long)uVar8 < 0) {
      print_result_cold_4();
    }
    break;
  case 3:
    pcVar7 = "%08X\n";
    goto LAB_001035ce;
  case 4:
    pcVar7 = "%u\n";
LAB_001035ce:
    printf(pcVar7,uVar5,uVar3);
    return;
  case 5:
    printf("%s",cmdUsage,uVar3);
    return;
  case 6:
    printf("%d",uVar5,uVar3);
    if ((long)uVar8 < 0) {
      print_result_cold_3();
    }
    if (aVar4.p3 != 0 && -1 < (long)uVar8) {
      if (printFlags == 2) {
        putchar(0x20);
      }
      uVar8 = 0;
      do {
        cVar1 = response_buf[uVar8];
        uVar6 = (uint)cVar1;
        if ((printFlags & 1U) == 0) {
          if ((printFlags & 2U) == 0) {
            pcVar7 = " %hhu";
            goto LAB_001036bc;
          }
          ppuVar2 = __ctype_b_loc();
          if (((((*ppuVar2)[(int)uVar6] >> 0xe & 1) == 0) && (cVar1 != '\r')) && (cVar1 != '\n')) {
            pcVar7 = "\\x%02hhx";
            goto LAB_001036bc;
          }
          putchar(uVar6);
        }
        else {
          pcVar7 = " %hhx";
LAB_001036bc:
          printf(pcVar7,(ulong)uVar6);
        }
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    goto LAB_001037d6;
  case 7:
    if (aVar4.p3 == 0x2c) {
      printf("%d",(ulong)(uint)response_buf._0_4_,uVar3);
      lVar9 = 1;
      do {
        printf(" %d",(ulong)*(uint *)(response_buf + lVar9 * 4));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0xb);
    }
    else {
      print_result_cold_2();
    }
LAB_001037d6:
    putchar(10);
    return;
  case 8:
    if (-1 < (long)uVar8) {
      printf("%d %d",(ulong)(aVar4.p3 - 3),(ulong)(uint)response_buf._0_4_);
      if (4 < (int)aVar4.p3) {
        if (printFlags == 2) {
          putchar(0x20);
        }
        uVar8 = 4;
        do {
          cVar1 = response_buf[uVar8];
          uVar6 = (uint)cVar1;
          if ((printFlags & 1U) == 0) {
            if ((printFlags & 2U) == 0) {
              pcVar7 = " %hhu";
              goto LAB_00103779;
            }
            ppuVar2 = __ctype_b_loc();
            if (((((*ppuVar2)[(int)uVar6] >> 0xe & 1) == 0) && (cVar1 != '\r')) && (cVar1 != '\n'))
            {
              pcVar7 = "\\x%02hhx";
              goto LAB_00103779;
            }
            putchar(uVar6);
          }
          else {
            pcVar7 = " %hhx";
LAB_00103779:
            printf(pcVar7,(ulong)uVar6);
          }
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      goto LAB_001037d6;
    }
    print_result_cold_1();
  }
  return;
}

Assistant:

void print_result(int sock, int rv, cmdCmd_t cmd)
{
   int i, r, ch;
   uint32_t *p;

   r = cmd.res;

   switch (rv)
   {
      case 0:
      case 1:
         if (r < 0)
         {
            printf("%d\n", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         }
         break;

      case 2:
         printf("%d\n", r);
         if (r < 0) report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         break;

      case 3:
         printf("%08X\n", cmd.res);
         break;

      case 4:
         printf("%u\n", cmd.res);
         break;

      case 5:
         printf("%s", cmdUsage);
         break;

      case 6: /*
                 BI2CZ  CF2  FL  FR  I2CPK  I2CRD  I2CRI  I2CRK
                 I2CZ  SERR  SLR  SPIX  SPIR
              */
         printf("%d", r);
         if (r < 0) report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         if (r > 0)
         {
            if (printFlags == PRINT_ASCII) printf(" ");

            for (i=0; i<r; i++)
            {
               ch = response_buf[i];

               if (printFlags & PRINT_HEX) printf(" %hhx", ch);

               else if (printFlags & PRINT_ASCII)
               {
                  if (isprint(ch) || (ch == '\n') || (ch == '\r'))
                     printf("%c", ch);
                  else printf("\\x%02hhx", ch);
               }
               else printf(" %hhu", response_buf[i]);
            }
         }
         printf("\n");
         break;

      case 7: /* PROCP */
         if (r != (4 + (4*PI_MAX_SCRIPT_PARAMS)))
         {
            printf("%d", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         }
         else
         {
            p = (uint32_t *)response_buf;
            printf("%d", p[0]);
            for (i=0; i<PI_MAX_SCRIPT_PARAMS; i++)
            {
               printf(" %d", p[i+1]);
            }
         }
         printf("\n");
         break;

      case 8: /*
                 BSCX
              */
         if (r < 0)
         {
            printf("%d\n", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
            break;
         }

         p = (uint32_t *)response_buf;
         printf("%d %d", r-3, p[0]);

         if (r > 4)
         {
            if (printFlags == PRINT_ASCII) printf(" ");

            for (i=4; i<r; i++)
            {
               ch = response_buf[i];

               if (printFlags & PRINT_HEX) printf(" %hhx", ch);

               else if (printFlags & PRINT_ASCII)
               {
                  if (isprint(ch) || (ch == '\n') || (ch == '\r'))
                     printf("%c", ch);
                  else printf("\\x%02hhx", ch);
               }
               else printf(" %hhu", response_buf[i]);
            }
         }
         printf("\n");
         break;

   }
}